

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polyedgecurve.h
# Opt level: O2

void __thiscall ON_PolyEdgeCurve::ON_PolyEdgeCurve(ON_PolyEdgeCurve *this,ON_PolyEdgeCurve *param_1)

{
  ON_PolyCurve::ON_PolyCurve(&this->super_ON_PolyCurve,&param_1->super_ON_PolyCurve);
  (this->super_ON_PolyCurve).super_ON_Curve.super_ON_Geometry.super_ON_Object._vptr_ON_Object =
       (_func_int **)&PTR_ClassId_00829f80;
  return;
}

Assistant:

class ON_CLASS ON_PolyEdgeCurve : public ON_PolyCurve
{
  ON_OBJECT_DECLARE(ON_PolyEdgeCurve);

public:
  ON_PolyEdgeCurve();
  ~ON_PolyEdgeCurve();
  // default copy constructor and operator= are fine.

  // virtual ON_Object::DestroyRuntimeCache override
  void DestroyRuntimeCache( bool bDelete = true ) override;

  // virtual ON_Curve::IsClosed override
  bool IsClosed() const override;

  // virtual ON_Curve::DuplicateCurve override
  ON_Curve* DuplicateCurve() const override;

  /*
  Description:
    Create a one segment ON_PolyEdgeCurve curve that uses a 
    single edge.
  */
  bool Create(
           const ON_BrepTrim* trim,
           const ON_UUID& object_id
           );

  /*
  Description:
    Create a one segment ON_PolyEdgeCurve curve that uses a 
    single curve.
  */
  bool Create(
           const ON_Curve* curve,
           const ON_UUID& object_id
           );

  int SegmentCount() const;

  ON_PolyEdgeSegment* SegmentCurve(
    int segment_index
    ) const;

  ON_PolyEdgeSegment* operator[](int) const;

  bool Prepend( ON_PolyEdgeSegment* new_segment ); // Prepend curve.
  bool Append( ON_PolyEdgeSegment* new_segment );  // Append curve.
  bool Insert( 
           int segment_index,
           ON_PolyEdgeSegment* new_segment
           );

  // if the segment is an edge, the following
  // return non-nullptr pointers.
  const ON_BrepEdge* EdgeAt(double t) const;
  const ON_BrepTrim* TrimAt(double t) const;
  const ON_Brep*     BrepAt(double t) const;
  const ON_BrepFace* FaceAt(double t) const;
  const ON_Surface*  SurfaceAt(double t) const;
  ON_Surface::ISO    IsoType( double t) const;

  double EdgeParameter(double t) const;

  // Test if there are any surface edges in the polyedge
  bool ContainsAnyEdges() const;
  // Test if all segments of the polyedge are surface edges
  bool ContainsAllEdges() const;
  

  /*
  Description:
    See if this polyedge has an edge as one of its segments
  Parameters:
    edge - [in] the edge to look for
  Returns:
     -1: edge is not in the polyedge
    >=0: index of first segment that uses the edge
  */
  int FindEdge( const ON_BrepEdge* edge) const;

  /*
  Description:
    See if this polyedge has a trim as one of its segments
  Parameters:
    trim - [in] the trim to look for
  Returns:
     -1: trim is not in the polyedge
    >=0: index of first segment that uses the trim
  */
  int FindTrim( const ON_BrepTrim* trim) const;

  /*
  Description:
    See if this polyedge has a wire curve as one of its segments
  Parameters:
    curve - [in] the curve to look for
  Returns:
     -1: trim is not in the polyedge
    >=0: index of first segment that uses the curve
  */
  int FindCurve( const ON_Curve* curve) const;


  // OBSOLETE and unreliable.  Use FindCurve, FindEdge, or FindTrim
  //bool Contains( const ON_Curve* curve) const;

  // virtual ON_Curve overrides do nothing
  // to prevent changing edge
  bool SetStartPoint(ON_3dPoint start_point) override;
  bool SetEndPoint(ON_3dPoint end_point) override;
  bool ChangeClosedCurveSeam( double t ) override;
  bool PrependAndMatch(ON_Curve*);
  bool AppendAndMatch(ON_Curve*);

  // 7-1-03 lw added override to unset cached closed flag
  // when a segment is removed
  bool Remove(); // remove last
  bool Remove( int index);
}